

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeDistanceCalculator.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  ostream *poVar4;
  rep rVar5;
  double dVar6;
  vector<int,_std::allocator<int>_> local_440;
  allocator local_421;
  string local_420 [39];
  allocator local_3f9;
  string local_3f8 [32];
  duration<long,_std::ratio<1L,_1000000000L>_> local_3d8;
  duration<long,_std::ratio<1L,_1000L>_> local_3d0;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_3c8;
  time_point end;
  Point<double> local_3a8;
  undefined1 local_390 [8];
  Point<double> c;
  Point<double> point;
  value_type *p;
  int n;
  undefined1 local_348 [8];
  vector<double,_std::allocator<double>_> dist;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tStack_328;
  int nnodes;
  time_point start;
  Facet *f;
  iterator __end1;
  iterator __begin1;
  vector<Parfait::Facet,_std::allocator<Parfait::Facet>_> *__range1;
  undefined1 local_2d0 [8];
  DistanceTree tree;
  STL stl;
  set<int,_std::less<int>,_std::allocator<int>_> tags;
  undefined1 local_1b8 [8];
  ImportedUgrid ugrid;
  undefined1 local_60 [7];
  bool is_big_endian;
  string filename;
  undefined1 local_30 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arguments;
  char **argv_local;
  int argc_local;
  
  arguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)argv;
  launderArguments_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_30,argc,argv);
  bVar1 = isVersionRequested((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_30);
  if (bVar1) {
    printVersionAndExit();
  }
  getFilename((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_60);
  std::__cxx11::string::string((string *)&ugrid.nfaces,(string *)local_60);
  bVar1 = isBigEndian((string *)&ugrid.nfaces);
  std::__cxx11::string::~string((string *)&ugrid.nfaces);
  std::__cxx11::string::string
            ((string *)&tags._M_t._M_impl.super__Rb_tree_header._M_node_count,(string *)local_60);
  Parfait::ImportedUgridFactory::readUgrid
            ((ImportedUgrid *)local_1b8,
             (string *)&tags._M_t._M_impl.super__Rb_tree_header._M_node_count,bVar1);
  std::__cxx11::string::~string((string *)&tags._M_t._M_impl.super__Rb_tree_header._M_node_count);
  getWallTags((set<int,_std::less<int>,_std::allocator<int>_> *)
              &stl.facets.super__Vector_base<Parfait::Facet,_std::allocator<Parfait::Facet>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage,(ImportedUgrid *)local_1b8);
  cacheSurface((STL *)&tree.max_objects_per_voxel,(ImportedUgrid *)local_1b8,
               (set<int,_std::less<int>,_std::allocator<int>_> *)
               &stl.facets.super__Vector_base<Parfait::Facet,_std::allocator<Parfait::Facet>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
  Parfait::STL::STL::findDomain((Extent<double> *)&__range1,(STL *)&tree.max_objects_per_voxel);
  Parfait::DistanceTree::DistanceTree((DistanceTree *)local_2d0,(Extent<double> *)&__range1);
  Parfait::Octree<Parfait::Facet>::setMaxDepth((Octree<Parfait::Facet> *)local_2d0,0x1a);
  __end1 = std::vector<Parfait::Facet,_std::allocator<Parfait::Facet>_>::begin
                     ((vector<Parfait::Facet,_std::allocator<Parfait::Facet>_> *)&stl.field_0x18);
  f = (Facet *)std::vector<Parfait::Facet,_std::allocator<Parfait::Facet>_>::end
                         ((vector<Parfait::Facet,_std::allocator<Parfait::Facet>_> *)&stl.field_0x18
                         );
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Parfait::Facet_*,_std::vector<Parfait::Facet,_std::allocator<Parfait::Facet>_>_>
                                     *)&f), bVar1) {
    start.__d.__r =
         (duration)
         __gnu_cxx::
         __normal_iterator<Parfait::Facet_*,_std::vector<Parfait::Facet,_std::allocator<Parfait::Facet>_>_>
         ::operator*(&__end1);
    Parfait::Octree<Parfait::Facet>::insert
              ((Octree<Parfait::Facet> *)local_2d0,(Facet *)start.__d.__r);
    __gnu_cxx::
    __normal_iterator<Parfait::Facet_*,_std::vector<Parfait::Facet,_std::allocator<Parfait::Facet>_>_>
    ::operator++(&__end1);
  }
  Parfait::Octree<Parfait::Facet>::finalize((Octree<Parfait::Facet> *)local_2d0);
  tStack_328.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  sVar2 = std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)local_1b8);
  dist.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = (uint)(sVar2 / 3);
  sVar2 = (size_type)
          (int)dist.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_;
  _n = -1.0;
  std::allocator<double>::allocator((allocator<double> *)((long)&p + 7));
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_348,sVar2,(value_type *)&n,
             (allocator<double> *)((long)&p + 7));
  std::allocator<double>::~allocator((allocator<double> *)((long)&p + 7));
  printf("Searching for distance of %d points\n",
         (ulong)dist.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._4_4_);
  for (p._0_4_ = 0;
      (int)p < (int)dist.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._4_4_; p._0_4_ = (int)p + 1) {
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_1b8,(long)((int)p * 3));
    Parfait::Point<double>::Point((Point<double> *)(c.pos._M_elems + 2),*pvVar3,pvVar3[1],pvVar3[2])
    ;
    Parfait::Point<double>::Point(&local_3a8,pvVar3);
    Parfait::DistanceTree::closestPoint
              ((Point<double> *)local_390,(DistanceTree *)local_2d0,&local_3a8);
    Parfait::Point<double>::operator-
              ((Point<double> *)&end,(Point<double> *)(c.pos._M_elems + 2),
               (Point<double> *)local_390);
    dVar6 = Parfait::Point<double>::magnitude((Point<double> *)&end);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_348,(long)(int)p);
    *pvVar3 = dVar6;
  }
  local_3c8.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  poVar4 = std::operator<<((ostream *)&std::cout,"Elapsed time ");
  local_3d8.__r = (rep)std::chrono::operator-(&local_3c8,&stack0xfffffffffffffcd8);
  local_3d0.__r =
       (rep)std::chrono::
            duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                      (&local_3d8);
  rVar5 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_3d0);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,rVar5);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3f8,"distance.txt",&local_3f9);
  writeToFile((string *)local_3f8,(vector<double,_std::allocator<double>_> *)local_348,
              (vector<double,_std::allocator<double>_> *)local_1b8);
  std::__cxx11::string::~string(local_3f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_420,"boundary.txt",&local_421);
  determineIfBoundaryNodes(&local_440,(ImportedUgrid *)local_1b8);
  writeBoundaryDistances
            ((string *)local_420,(vector<double,_std::allocator<double>_> *)local_348,&local_440);
  std::vector<int,_std::allocator<int>_>::~vector(&local_440);
  std::__cxx11::string::~string(local_420);
  std::allocator<char>::~allocator((allocator<char> *)&local_421);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_348);
  Parfait::DistanceTree::~DistanceTree((DistanceTree *)local_2d0);
  Parfait::STL::STL::~STL((STL *)&tree.max_objects_per_voxel);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)
             &stl.facets.super__Vector_base<Parfait::Facet,_std::allocator<Parfait::Facet>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage);
  Parfait::ImportedUgrid::~ImportedUgrid((ImportedUgrid *)local_1b8);
  std::__cxx11::string::~string((string *)local_60);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_30);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
    std::vector<std::string> arguments = launderArguments(argc, argv);
    if(isVersionRequested(arguments))
        printVersionAndExit();

    std::string filename = getFilename(arguments);
    bool is_big_endian = isBigEndian(filename);

    auto ugrid = Parfait::ImportedUgridFactory::readUgrid(filename, is_big_endian);
    auto tags = getWallTags(ugrid);


    auto stl = cacheSurface(ugrid, tags);

    Parfait::DistanceTree tree(stl.findDomain());
    tree.setMaxDepth(26);

    for(const auto& f : stl.facets){
        tree.insert(f);
    }
    tree.finalize();

    auto start = std::chrono::system_clock::now();
    int nnodes = ugrid.nodes.size() / 3;
    std::vector<double> dist(nnodes, -1);
    printf("Searching for distance of %d points\n", nnodes);
#pragma omp parallel for schedule(guided)
    for(int n = 0; n < nnodes; n++){
        auto p = &ugrid.nodes[3*n+0];
        Parfait::Point<double> point(p[0], p[1], p[2]);
        auto c = tree.closestPoint(p);
        dist[n] = (point - c).magnitude();
    }
    auto end = std::chrono::system_clock::now();
    std::cout << "Elapsed time " << std::chrono::duration_cast<std::chrono::milliseconds>(end - start).count() << std::endl;

    writeToFile("distance.txt", dist, ugrid.nodes);
    writeBoundaryDistances("boundary.txt", dist, determineIfBoundaryNodes(ugrid));
    //printf("Exporting <%s> as vtu.", filename.c_str());
    //Parfait::VtkUnstructuredWriter writer(filename, ugrid);
    //writer.addNodeData("distance", dist.data(), 1);
    //writer.writeBinary();
}